

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

int google::protobuf::internal::CalculateReserveSize<int,8>(int capacity,int new_size)

{
  uint uVar1;
  LogMessage *pLVar2;
  LogMessage local_20;
  
  if (new_size < 2) {
    new_size = 2;
  }
  else if (capacity < 0x3ffffffc) {
    if (capacity < 2 && capacity != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_20,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0x493,"capacity == 0 || capacity >= lower_limit");
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(&local_20,capacity);
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar2,(char (*) [2])0x4eba42);
      absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,2);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_20);
    }
    uVar1 = capacity * 2 + 2;
    if ((uint)new_size < uVar1) {
      new_size = uVar1;
    }
  }
  else {
    new_size = 0x7fffffff;
  }
  return new_size;
}

Assistant:

inline int CalculateReserveSize(int capacity, int new_size) {
  constexpr int lower_limit =
      RepeatedFieldLowerClampLimit<T, kHeapRepHeaderSize>();
  if (new_size < lower_limit) {
    // Clamp to smallest allowed size.
    return lower_limit;
  }
  constexpr int kMaxSizeBeforeClamp =
      (std::numeric_limits<int>::max() - kHeapRepHeaderSize) / 2;
  if (ABSL_PREDICT_FALSE(capacity > kMaxSizeBeforeClamp)) {
    return std::numeric_limits<int>::max();
  }
  constexpr int kSooCapacityElements = SooCapacityElements(sizeof(T));
  if (kSooCapacityElements > 0 && kSooCapacityElements < lower_limit) {
    // In this case, we need to set capacity to 0 here to ensure power-of-two
    // sized allocations.
    if (capacity < lower_limit) capacity = 0;
  } else {
    ABSL_DCHECK(capacity == 0 || capacity >= lower_limit)
        << capacity << " " << lower_limit;
  }
  // We want to double the number of bytes, not the number of elements, to try
  // to stay within power-of-two allocations.
  // The allocation has kHeapRepHeaderSize + sizeof(T) * capacity.
  int doubled_size = 2 * capacity + kHeapRepHeaderSize / sizeof(T);
  return std::max(doubled_size, new_size);
}